

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  BVH *bvh;
  size_t sVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  Ref<embree::Geometry> *pRVar14;
  long lVar15;
  RTCIntersectArguments *k;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  byte bVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  RayK<4> *pRVar34;
  undefined4 uVar35;
  RTCIntersectArguments *pRVar36;
  int iVar37;
  uint uVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  long lVar42;
  NodeRef root;
  size_t sVar43;
  ulong uVar44;
  size_t sVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar49;
  float *pfVar50;
  ulong uVar51;
  ulong uVar52;
  NodeRef *pNVar53;
  bool bVar54;
  float fVar73;
  vint4 bi_1;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar71;
  undefined1 auVar72 [16];
  byte bVar74;
  uint uVar75;
  float fVar76;
  byte bVar87;
  byte bVar88;
  byte bVar90;
  uint uVar91;
  byte bVar93;
  byte bVar94;
  float fVar95;
  vint4 ai_10;
  undefined1 auVar78 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar79;
  byte bVar89;
  undefined1 auVar80 [16];
  float fVar92;
  float fVar96;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar97;
  float fVar98;
  float fVar110;
  float fVar112;
  vint4 bi;
  float fVar114;
  undefined1 auVar99 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar100;
  undefined1 auVar101 [16];
  float fVar111;
  float fVar113;
  float fVar115;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar116;
  float fVar117;
  float fVar123;
  float fVar125;
  vint4 ai;
  undefined1 auVar118 [16];
  float fVar127;
  undefined1 auVar119 [16];
  float fVar124;
  float fVar126;
  float fVar128;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar129;
  float fVar132;
  float fVar133;
  vint4 ai_1;
  float fVar134;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar135;
  float fVar136;
  float fVar140;
  float fVar142;
  vint4 ai_3;
  undefined1 auVar137 [16];
  float fVar141;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar146;
  uint uVar147;
  float fVar151;
  float fVar155;
  vint4 bi_2;
  uint uVar152;
  uint uVar156;
  float fVar158;
  uint uVar159;
  undefined1 auVar148 [16];
  uint uVar153;
  uint uVar157;
  uint uVar160;
  undefined1 auVar149 [16];
  float fVar154;
  undefined1 auVar150 [16];
  float fVar161;
  float fVar162;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  vint4 bi_3;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar169;
  uint uVar170;
  float fVar171;
  uint uVar172;
  float fVar173;
  uint uVar174;
  float fVar175;
  vint4 ai_2;
  uint uVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  int iVar195;
  float fVar196;
  float fVar197;
  int iVar198;
  float fVar199;
  float fVar200;
  int iVar201;
  float fVar202;
  float fVar203;
  uint uVar204;
  float fVar205;
  uint uVar206;
  float fVar207;
  uint uVar208;
  float fVar209;
  uint uVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 local_1c28 [16];
  Precalculations pre;
  undefined1 local_1c08 [8];
  float fStack_1c00;
  float fStack_1bfc;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined1 local_1be8 [8];
  undefined8 uStack_1be0;
  undefined1 local_1bd8 [16];
  float local_1bc8;
  float local_1bb8;
  float fStack_1bb4;
  float fStack_1bb0;
  float fStack_1bac;
  undefined1 local_1ba8 [16];
  float local_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  vfloat<4> upper_y;
  vbool<4> terminated;
  vfloat<4> lower_y;
  vfloat<4> upper_z;
  vfloat<4> lower_z;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  TravRayK<4,_false> tray;
  vfloat<4> upper_x;
  vfloat<4> lower_x;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar77 [16];
  
  uVar30 = mm_lookupmask_ps._8_8_;
  uVar29 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    pRVar36 = (RTCIntersectArguments *)ray;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pRVar36 = context->args,
       (pRVar36->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent((BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::SubGridIntersectorKMoeller<4,_4,_true>,_true>
                        *)valid_i,(vint<4> *)This,(Intersectors *)ray,(RayK<4> *)context,
                       (RayQueryContext *)bvh);
      return;
    }
    auVar118 = *(undefined1 (*) [16])(ray + 0x80);
    auVar122._0_12_ = ZEXT812(0);
    auVar122._12_4_ = 0;
    uVar75 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar118._0_4_);
    uVar91 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar118._4_4_);
    auVar77._0_8_ = CONCAT44(uVar91,uVar75);
    auVar77._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar118._8_4_);
    auVar77._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar118._12_4_);
    iVar37 = movmskps((int)pRVar36,auVar77);
    if (iVar37 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar146 = (float)DAT_01f80d30;
      fVar151 = DAT_01f80d30._4_4_;
      fVar155 = DAT_01f80d30._8_4_;
      fVar158 = DAT_01f80d30._12_4_;
      auVar56._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar151);
      auVar56._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar146);
      auVar56._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar155);
      auVar56._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar158);
      auVar163 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f80d30,auVar56
                         );
      auVar78._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar151);
      auVar78._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar146);
      auVar78._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar155);
      auVar78._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar158);
      auVar78 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f80d30,auVar78)
      ;
      auVar55._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar151);
      auVar55._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar146);
      auVar55._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar155);
      auVar55._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar158);
      auVar137 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f80d30,auVar55
                         );
      auVar56 = rcpps(auVar55,auVar163);
      fVar146 = auVar56._0_4_;
      auVar164._0_4_ = auVar163._0_4_ * fVar146;
      fVar151 = auVar56._4_4_;
      auVar164._4_4_ = auVar163._4_4_ * fVar151;
      fVar155 = auVar56._8_4_;
      auVar164._8_4_ = auVar163._8_4_ * fVar155;
      fVar158 = auVar56._12_4_;
      auVar164._12_4_ = auVar163._12_4_ * fVar158;
      tray.rdir.field_0._0_4_ = (1.0 - auVar164._0_4_) * fVar146 + fVar146;
      tray.rdir.field_0._4_4_ = (1.0 - auVar164._4_4_) * fVar151 + fVar151;
      tray.rdir.field_0._8_4_ = (1.0 - auVar164._8_4_) * fVar155 + fVar155;
      tray.rdir.field_0._12_4_ = (1.0 - auVar164._12_4_) * fVar158 + fVar158;
      auVar56 = rcpps(auVar164,auVar78);
      fVar146 = auVar56._0_4_;
      fVar151 = auVar56._4_4_;
      fVar155 = auVar56._8_4_;
      fVar158 = auVar56._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar78._0_4_ * fVar146) * fVar146 + fVar146;
      tray.rdir.field_0._20_4_ = (1.0 - auVar78._4_4_ * fVar151) * fVar151 + fVar151;
      tray.rdir.field_0._24_4_ = (1.0 - auVar78._8_4_ * fVar155) * fVar155 + fVar155;
      tray.rdir.field_0._28_4_ = (1.0 - auVar78._12_4_ * fVar158) * fVar158 + fVar158;
      auVar56 = rcpps(auVar56,auVar137);
      fVar146 = auVar56._0_4_;
      fVar151 = auVar56._4_4_;
      fVar155 = auVar56._8_4_;
      fVar158 = auVar56._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar137._0_4_ * fVar146) * fVar146 + fVar146;
      tray.rdir.field_0._36_4_ = (1.0 - auVar137._4_4_ * fVar151) * fVar151 + fVar151;
      tray.rdir.field_0._40_4_ = (1.0 - auVar137._8_4_ * fVar155) * fVar155 + fVar155;
      tray.rdir.field_0._44_4_ = (1.0 - auVar137._12_4_ * fVar158) * fVar158 + fVar158;
      auVar137._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar137._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar137._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar137._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar137);
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar163._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar163._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar163._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar163._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar163);
      auVar56 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar122);
      auVar118 = maxps(auVar118,auVar122);
      iVar37 = (int)DAT_01f7a9f0;
      iVar195 = DAT_01f7a9f0._4_4_;
      iVar198 = DAT_01f7a9f0._8_4_;
      iVar201 = DAT_01f7a9f0._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar56,auVar77);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar118,auVar77);
      terminated.field_0._0_8_ = auVar77._0_8_ ^ 0xffffffffffffffff;
      terminated.field_0.i[2] = auVar77._8_4_ ^ 0xffffffff;
      terminated.field_0.i[3] = auVar77._12_4_ ^ 0xffffffff;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar38 = 3;
        pRVar36 = (RTCIntersectArguments *)0x0;
      }
      else {
        pRVar36 = (RTCIntersectArguments *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        uVar38 = ((char)pRVar36 == '\0') + 2;
      }
      pNVar53 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar49 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar31 = 0x21d2f80;
LAB_00dc1205:
      do {
        do {
          root.ptr = pNVar53[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00dc29de;
          pNVar53 = pNVar53 + -1;
          paVar49 = paVar49 + -1;
          aVar79.v = *(__m128 *)paVar49->v;
          auVar118._4_4_ = -(uint)(aVar79.v[1] < tray.tfar.field_0.v[1]);
          auVar118._0_4_ = -(uint)(aVar79.v[0] < tray.tfar.field_0.v[0]);
          auVar118._8_4_ = -(uint)(aVar79.v[2] < tray.tfar.field_0.v[2]);
          auVar118._12_4_ = -(uint)(aVar79._12_4_ < tray.tfar.field_0.v[3]);
          uVar31 = movmskps(uVar31,auVar118);
        } while (uVar31 == 0);
        uVar52 = (ulong)(byte)uVar31;
        uVar152 = uVar31 & 0xff;
        if (uVar38 < (uint)POPCOUNT(uVar152)) {
LAB_00dc124a:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00dc29de;
              auVar59._4_4_ = -(uint)(aVar79.v[1] < tray.tfar.field_0.v[1]);
              auVar59._0_4_ = -(uint)(aVar79.v[0] < tray.tfar.field_0.v[0]);
              auVar59._8_4_ = -(uint)(aVar79.v[2] < tray.tfar.field_0.v[2]);
              auVar59._12_4_ = -(uint)(aVar79.v[3] < tray.tfar.field_0.v[3]);
              uVar31 = movmskps(uVar31,auVar59);
              if (uVar31 != 0) {
                uVar52 = (ulong)((uint)root.ptr & 0xf);
                if (uVar52 == 8) {
                  lVar39 = 0;
                  aVar71 = terminated.field_0;
                }
                else {
                  uVar44 = root.ptr & 0xfffffffffffffff0;
                  local_1ba8._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                  local_1ba8._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                  local_1ba8._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                  lVar39 = 0;
                  do {
                    lVar40 = lVar39 * 0x58;
                    uVar46 = *(ulong *)(uVar44 + 0x20 + lVar40);
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = uVar46;
                    uVar6 = *(undefined8 *)(uVar44 + 0x24 + lVar40);
                    bVar16 = (byte)uVar46;
                    bVar74 = (byte)uVar6;
                    bVar17 = (byte)(uVar46 >> 8);
                    bVar87 = (byte)((ulong)uVar6 >> 8);
                    bVar18 = (byte)(uVar46 >> 0x10);
                    bVar88 = (byte)((ulong)uVar6 >> 0x10);
                    bVar19 = (byte)(uVar46 >> 0x18);
                    bVar89 = (byte)((ulong)uVar6 >> 0x18);
                    bVar20 = (byte)(uVar46 >> 0x20);
                    bVar90 = (byte)((ulong)uVar6 >> 0x20);
                    bVar21 = (byte)(uVar46 >> 0x28);
                    bVar93 = (byte)((ulong)uVar6 >> 0x28);
                    bVar22 = (byte)(uVar46 >> 0x30);
                    bVar94 = (byte)((ulong)uVar6 >> 0x30);
                    bVar28 = (byte)((ulong)uVar6 >> 0x38);
                    bVar23 = (byte)(uVar46 >> 0x38);
                    auVar80[0] = -((byte)((bVar16 < bVar74) * bVar16 | (bVar16 >= bVar74) * bVar74)
                                  == bVar16);
                    auVar80[1] = -((byte)((bVar17 < bVar87) * bVar17 | (bVar17 >= bVar87) * bVar87)
                                  == bVar17);
                    auVar80[2] = -((byte)((bVar18 < bVar88) * bVar18 | (bVar18 >= bVar88) * bVar88)
                                  == bVar18);
                    auVar80[3] = -((byte)((bVar19 < bVar89) * bVar19 | (bVar19 >= bVar89) * bVar89)
                                  == bVar19);
                    auVar80[4] = -((byte)((bVar20 < bVar90) * bVar20 | (bVar20 >= bVar90) * bVar90)
                                  == bVar20);
                    auVar80[5] = -((byte)((bVar21 < bVar93) * bVar21 | (bVar21 >= bVar93) * bVar93)
                                  == bVar21);
                    auVar80[6] = -((byte)((bVar22 < bVar94) * bVar22 | (bVar22 >= bVar94) * bVar94)
                                  == bVar22);
                    auVar80[7] = -((byte)((bVar23 < bVar28) * bVar23 | (bVar23 >= bVar28) * bVar28)
                                  == bVar23);
                    auVar80[8] = 0xff;
                    auVar80[9] = 0xff;
                    auVar80[10] = 0xff;
                    auVar80[0xb] = 0xff;
                    auVar80[0xc] = 0xff;
                    auVar80[0xd] = 0xff;
                    auVar80[0xe] = 0xff;
                    auVar80[0xf] = 0xff;
                    auVar101._8_4_ = 0xffffffff;
                    auVar101._0_8_ = 0xffffffffffffffff;
                    auVar101._12_4_ = 0xffffffff;
                    auVar118 = pmovzxbd(auVar60,auVar80 ^ auVar101);
                    auVar118 = auVar118 ^ auVar101;
                    auVar61._0_4_ = auVar118._0_4_ << 0x1f;
                    auVar61._4_4_ = auVar118._4_4_ << 0x1f;
                    auVar61._8_4_ = auVar118._8_4_ << 0x1f;
                    auVar61._12_4_ = auVar118._12_4_ << 0x1f;
                    uVar31 = movmskps((int)lVar39,auVar61);
                    if (uVar31 != 0) {
                      lVar40 = lVar40 + uVar44;
                      uVar46 = (ulong)(uVar31 & 0xff);
                      do {
                        lVar15 = 0;
                        if (uVar46 != 0) {
                          for (; (uVar46 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                          }
                        }
                        auVar62._8_8_ = 0;
                        auVar62._0_8_ = *(ulong *)(lVar40 + 0x20);
                        auVar118 = pmovzxbd(auVar62,auVar62);
                        fVar146 = *(float *)(lVar40 + 0x38);
                        fVar151 = *(float *)(lVar40 + 0x44);
                        lower_x.field_0.v[1] = (float)auVar118._4_4_ * fVar151 + fVar146;
                        lower_x.field_0.v[0] = (float)auVar118._0_4_ * fVar151 + fVar146;
                        lower_x.field_0.v[3] = (float)auVar118._12_4_ * fVar151 + fVar146;
                        lower_x.field_0.v[2] = (float)auVar118._8_4_ * fVar151 + fVar146;
                        auVar63._8_8_ = 0;
                        auVar63._0_8_ = *(ulong *)(lVar40 + 0x24);
                        auVar118 = pmovzxbd(auVar63,auVar63);
                        upper_x.field_0.v[0] = (float)auVar118._0_4_ * fVar151 + fVar146;
                        upper_x.field_0.v[1] = (float)auVar118._4_4_ * fVar151 + fVar146;
                        upper_x.field_0.v[2] = (float)auVar118._8_4_ * fVar151 + fVar146;
                        upper_x.field_0.v[3] = (float)auVar118._12_4_ * fVar151 + fVar146;
                        auVar64._8_8_ = 0;
                        auVar64._0_8_ = *(ulong *)(lVar40 + 0x28);
                        auVar118 = pmovzxbd(auVar64,auVar64);
                        fVar146 = *(float *)(lVar40 + 0x3c);
                        fVar151 = *(float *)(lVar40 + 0x48);
                        lower_y.field_0.v[1] = (float)auVar118._4_4_ * fVar151 + fVar146;
                        lower_y.field_0.v[0] = (float)auVar118._0_4_ * fVar151 + fVar146;
                        lower_y.field_0.v[3] = (float)auVar118._12_4_ * fVar151 + fVar146;
                        lower_y.field_0.v[2] = (float)auVar118._8_4_ * fVar151 + fVar146;
                        auVar65._8_8_ = 0;
                        auVar65._0_8_ = *(ulong *)(lVar40 + 0x2c);
                        auVar118 = pmovzxbd(auVar65,auVar65);
                        upper_y.field_0.v[1] = (float)auVar118._4_4_ * fVar151 + fVar146;
                        upper_y.field_0.v[0] = (float)auVar118._0_4_ * fVar151 + fVar146;
                        upper_y.field_0.v[2] = (float)auVar118._8_4_ * fVar151 + fVar146;
                        upper_y.field_0.v[3] = (float)auVar118._12_4_ * fVar151 + fVar146;
                        auVar66._8_8_ = 0;
                        auVar66._0_8_ = *(ulong *)(lVar40 + 0x30);
                        auVar118 = pmovzxbd(auVar66,auVar66);
                        fVar146 = *(float *)(lVar40 + 0x40);
                        fVar151 = *(float *)(lVar40 + 0x4c);
                        lower_z.field_0.v[1] = (float)auVar118._4_4_ * fVar151 + fVar146;
                        lower_z.field_0.v[0] = (float)auVar118._0_4_ * fVar151 + fVar146;
                        lower_z.field_0.v[3] = (float)auVar118._12_4_ * fVar151 + fVar146;
                        lower_z.field_0.v[2] = (float)auVar118._8_4_ * fVar151 + fVar146;
                        auVar67._8_8_ = 0;
                        auVar67._0_8_ = *(ulong *)(lVar40 + 0x34);
                        auVar118 = pmovzxbd(auVar67,auVar67);
                        upper_z.field_0.v[1] = (float)auVar118._4_4_ * fVar151 + fVar146;
                        upper_z.field_0.v[0] = (float)auVar118._0_4_ * fVar151 + fVar146;
                        upper_z.field_0.v[3] = (float)auVar118._12_4_ * fVar151 + fVar146;
                        upper_z.field_0.v[2] = (float)auVar118._8_4_ * fVar151 + fVar146;
                        fVar146 = lower_x.field_0.v[lVar15];
                        fVar151 = (fVar146 - (float)tray.org.field_0._0_4_) *
                                  (float)tray.rdir.field_0._0_4_;
                        fVar155 = (fVar146 - (float)tray.org.field_0._4_4_) *
                                  (float)tray.rdir.field_0._4_4_;
                        fVar158 = (fVar146 - (float)tray.org.field_0._8_4_) *
                                  (float)tray.rdir.field_0._8_4_;
                        fVar73 = (fVar146 - (float)tray.org.field_0._12_4_) *
                                 (float)tray.rdir.field_0._12_4_;
                        fVar146 = lower_y.field_0.v[lVar15];
                        fVar97 = (fVar146 - (float)tray.org.field_0._16_4_) *
                                 (float)tray.rdir.field_0._16_4_;
                        fVar110 = (fVar146 - (float)tray.org.field_0._20_4_) *
                                  (float)tray.rdir.field_0._20_4_;
                        fVar112 = (fVar146 - (float)tray.org.field_0._24_4_) *
                                  (float)tray.rdir.field_0._24_4_;
                        fVar114 = (fVar146 - (float)tray.org.field_0._28_4_) *
                                  (float)tray.rdir.field_0._28_4_;
                        fVar146 = lower_z.field_0.v[lVar15];
                        fVar116 = (fVar146 - (float)tray.org.field_0._32_4_) *
                                  (float)tray.rdir.field_0._32_4_;
                        fVar123 = (fVar146 - (float)tray.org.field_0._36_4_) *
                                  (float)tray.rdir.field_0._36_4_;
                        fVar125 = (fVar146 - (float)tray.org.field_0._40_4_) *
                                  (float)tray.rdir.field_0._40_4_;
                        fVar127 = (fVar146 - (float)tray.org.field_0._44_4_) *
                                  (float)tray.rdir.field_0._44_4_;
                        fVar146 = upper_x.field_0.v[lVar15];
                        fVar129 = (fVar146 - (float)tray.org.field_0._0_4_) *
                                  (float)tray.rdir.field_0._0_4_;
                        fVar132 = (fVar146 - (float)tray.org.field_0._4_4_) *
                                  (float)tray.rdir.field_0._4_4_;
                        fVar133 = (fVar146 - (float)tray.org.field_0._8_4_) *
                                  (float)tray.rdir.field_0._8_4_;
                        fVar134 = (fVar146 - (float)tray.org.field_0._12_4_) *
                                  (float)tray.rdir.field_0._12_4_;
                        fVar146 = upper_y.field_0.v[lVar15];
                        fVar145 = (fVar146 - (float)tray.org.field_0._16_4_) *
                                  (float)tray.rdir.field_0._16_4_;
                        fVar161 = (fVar146 - (float)tray.org.field_0._20_4_) *
                                  (float)tray.rdir.field_0._20_4_;
                        fVar165 = (fVar146 - (float)tray.org.field_0._24_4_) *
                                  (float)tray.rdir.field_0._24_4_;
                        fVar167 = (fVar146 - (float)tray.org.field_0._28_4_) *
                                  (float)tray.rdir.field_0._28_4_;
                        fVar146 = upper_z.field_0.v[lVar15];
                        fVar135 = (fVar146 - (float)tray.org.field_0._32_4_) *
                                  (float)tray.rdir.field_0._32_4_;
                        fVar140 = (fVar146 - (float)tray.org.field_0._36_4_) *
                                  (float)tray.rdir.field_0._36_4_;
                        fVar142 = (fVar146 - (float)tray.org.field_0._40_4_) *
                                  (float)tray.rdir.field_0._40_4_;
                        fVar146 = (fVar146 - (float)tray.org.field_0._44_4_) *
                                  (float)tray.rdir.field_0._44_4_;
                        uVar31 = (uint)((int)fVar129 < (int)fVar151) * (int)fVar129 |
                                 (uint)((int)fVar129 >= (int)fVar151) * (int)fVar151;
                        uVar152 = (uint)((int)fVar132 < (int)fVar155) * (int)fVar132 |
                                  (uint)((int)fVar132 >= (int)fVar155) * (int)fVar155;
                        uVar156 = (uint)((int)fVar133 < (int)fVar158) * (int)fVar133 |
                                  (uint)((int)fVar133 >= (int)fVar158) * (int)fVar158;
                        uVar159 = (uint)((int)fVar134 < (int)fVar73) * (int)fVar134 |
                                  (uint)((int)fVar134 >= (int)fVar73) * (int)fVar73;
                        uVar170 = (uint)((int)fVar145 < (int)fVar97) * (int)fVar145 |
                                  (uint)((int)fVar145 >= (int)fVar97) * (int)fVar97;
                        uVar172 = (uint)((int)fVar161 < (int)fVar110) * (int)fVar161 |
                                  (uint)((int)fVar161 >= (int)fVar110) * (int)fVar110;
                        uVar174 = (uint)((int)fVar165 < (int)fVar112) * (int)fVar165 |
                                  (uint)((int)fVar165 >= (int)fVar112) * (int)fVar112;
                        uVar176 = (uint)((int)fVar167 < (int)fVar114) * (int)fVar167 |
                                  (uint)((int)fVar167 >= (int)fVar114) * (int)fVar114;
                        uVar170 = ((int)uVar170 < (int)uVar31) * uVar31 |
                                  ((int)uVar170 >= (int)uVar31) * uVar170;
                        uVar172 = ((int)uVar172 < (int)uVar152) * uVar152 |
                                  ((int)uVar172 >= (int)uVar152) * uVar172;
                        uVar174 = ((int)uVar174 < (int)uVar156) * uVar156 |
                                  ((int)uVar174 >= (int)uVar156) * uVar174;
                        uVar176 = ((int)uVar176 < (int)uVar159) * uVar159 |
                                  ((int)uVar176 >= (int)uVar159) * uVar176;
                        uVar31 = (uint)((int)fVar135 < (int)fVar116) * (int)fVar135 |
                                 (uint)((int)fVar135 >= (int)fVar116) * (int)fVar116;
                        uVar152 = (uint)((int)fVar140 < (int)fVar123) * (int)fVar140 |
                                  (uint)((int)fVar140 >= (int)fVar123) * (int)fVar123;
                        uVar156 = (uint)((int)fVar142 < (int)fVar125) * (int)fVar142 |
                                  (uint)((int)fVar142 >= (int)fVar125) * (int)fVar125;
                        uVar159 = (uint)((int)fVar146 < (int)fVar127) * (int)fVar146 |
                                  (uint)((int)fVar146 >= (int)fVar127) * (int)fVar127;
                        uVar31 = ((int)uVar31 < (int)uVar170) * uVar170 |
                                 ((int)uVar31 >= (int)uVar170) * uVar31;
                        uVar152 = ((int)uVar152 < (int)uVar172) * uVar172 |
                                  ((int)uVar152 >= (int)uVar172) * uVar152;
                        uVar156 = ((int)uVar156 < (int)uVar174) * uVar174 |
                                  ((int)uVar156 >= (int)uVar174) * uVar156;
                        uVar159 = ((int)uVar159 < (int)uVar176) * uVar176 |
                                  ((int)uVar159 >= (int)uVar176) * uVar159;
                        uVar170 = (uint)((int)fVar129 < (int)fVar151) * (int)fVar151 |
                                  (uint)((int)fVar129 >= (int)fVar151) * (int)fVar129;
                        uVar172 = (uint)((int)fVar132 < (int)fVar155) * (int)fVar155 |
                                  (uint)((int)fVar132 >= (int)fVar155) * (int)fVar132;
                        uVar174 = (uint)((int)fVar133 < (int)fVar158) * (int)fVar158 |
                                  (uint)((int)fVar133 >= (int)fVar158) * (int)fVar133;
                        uVar176 = (uint)((int)fVar134 < (int)fVar73) * (int)fVar73 |
                                  (uint)((int)fVar134 >= (int)fVar73) * (int)fVar134;
                        uVar147 = (uint)((int)fVar145 < (int)fVar97) * (int)fVar97 |
                                  (uint)((int)fVar145 >= (int)fVar97) * (int)fVar145;
                        uVar153 = (uint)((int)fVar161 < (int)fVar110) * (int)fVar110 |
                                  (uint)((int)fVar161 >= (int)fVar110) * (int)fVar161;
                        uVar157 = (uint)((int)fVar165 < (int)fVar112) * (int)fVar112 |
                                  (uint)((int)fVar165 >= (int)fVar112) * (int)fVar165;
                        uVar160 = (uint)((int)fVar167 < (int)fVar114) * (int)fVar114 |
                                  (uint)((int)fVar167 >= (int)fVar114) * (int)fVar167;
                        uVar147 = ((int)uVar170 < (int)uVar147) * uVar170 |
                                  ((int)uVar170 >= (int)uVar147) * uVar147;
                        uVar153 = ((int)uVar172 < (int)uVar153) * uVar172 |
                                  ((int)uVar172 >= (int)uVar153) * uVar153;
                        uVar157 = ((int)uVar174 < (int)uVar157) * uVar174 |
                                  ((int)uVar174 >= (int)uVar157) * uVar157;
                        uVar160 = ((int)uVar176 < (int)uVar160) * uVar176 |
                                  ((int)uVar176 >= (int)uVar160) * uVar160;
                        uVar170 = (uint)((int)fVar135 < (int)fVar116) * (int)fVar116 |
                                  (uint)((int)fVar135 >= (int)fVar116) * (int)fVar135;
                        uVar172 = (uint)((int)fVar140 < (int)fVar123) * (int)fVar123 |
                                  (uint)((int)fVar140 >= (int)fVar123) * (int)fVar140;
                        uVar174 = (uint)((int)fVar142 < (int)fVar125) * (int)fVar125 |
                                  (uint)((int)fVar142 >= (int)fVar125) * (int)fVar142;
                        uVar176 = (uint)((int)fVar146 < (int)fVar127) * (int)fVar127 |
                                  (uint)((int)fVar146 >= (int)fVar127) * (int)fVar146;
                        uVar170 = ((int)uVar147 < (int)uVar170) * uVar147 |
                                  ((int)uVar147 >= (int)uVar170) * uVar170;
                        uVar172 = ((int)uVar153 < (int)uVar172) * uVar153 |
                                  ((int)uVar153 >= (int)uVar172) * uVar172;
                        uVar174 = ((int)uVar157 < (int)uVar174) * uVar157 |
                                  ((int)uVar157 >= (int)uVar174) * uVar174;
                        uVar176 = ((int)uVar160 < (int)uVar176) * uVar160 |
                                  ((int)uVar160 >= (int)uVar176) * uVar176;
                        uVar147 = local_1ba8._0_4_;
                        auVar119._0_4_ =
                             -(uint)((float)((uint)((int)uVar31 < tray.tnear.field_0.i[0]) *
                                             tray.tnear.field_0.i[0] |
                                            ((int)uVar31 >= tray.tnear.field_0.i[0]) * uVar31) <=
                                    (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar170) *
                                            tray.tfar.field_0.i[0] |
                                           (tray.tfar.field_0.i[0] >= (int)uVar170) * uVar170)) &
                             uVar147;
                        uVar170 = local_1ba8._4_4_;
                        auVar119._4_4_ =
                             -(uint)((float)((uint)((int)uVar152 < tray.tnear.field_0.i[1]) *
                                             tray.tnear.field_0.i[1] |
                                            ((int)uVar152 >= tray.tnear.field_0.i[1]) * uVar152) <=
                                    (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar172) *
                                            tray.tfar.field_0.i[1] |
                                           (tray.tfar.field_0.i[1] >= (int)uVar172) * uVar172)) &
                             uVar170;
                        uVar152 = local_1ba8._8_4_;
                        auVar119._8_4_ =
                             -(uint)((float)((uint)((int)uVar156 < tray.tnear.field_0.i[2]) *
                                             tray.tnear.field_0.i[2] |
                                            ((int)uVar156 >= tray.tnear.field_0.i[2]) * uVar156) <=
                                    (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar174) *
                                            tray.tfar.field_0.i[2] |
                                           (tray.tfar.field_0.i[2] >= (int)uVar174) * uVar174)) &
                             uVar152;
                        uVar156 = local_1ba8._12_4_;
                        auVar119._12_4_ =
                             -(uint)((float)((uint)((int)uVar159 < tray.tnear.field_0.i[3]) *
                                             tray.tnear.field_0.i[3] |
                                            ((int)uVar159 >= tray.tnear.field_0.i[3]) * uVar159) <=
                                    (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar176) *
                                            tray.tfar.field_0.i[3] |
                                           (tray.tfar.field_0.i[3] >= (int)uVar176) * uVar176)) &
                             uVar156;
                        uVar31 = movmskps((int)pRVar36,auVar119);
                        pRVar36 = (RTCIntersectArguments *)(ulong)uVar31;
                        if (uVar31 == 0) {
                          bVar54 = false;
                        }
                        else {
                          uVar7 = *(ushort *)(lVar40 + lVar15 * 8);
                          uVar8 = *(ushort *)(lVar40 + 2 + lVar15 * 8);
                          uVar31 = *(uint *)(lVar40 + 0x50);
                          uVar159 = *(uint *)(lVar40 + 4 + lVar15 * 8);
                          pGVar10 = (context->scene->geometries).items[uVar31].ptr;
                          lVar11 = *(long *)&pGVar10->field_0x58;
                          lVar12 = *(long *)&pGVar10[1].time_range.upper;
                          valid_i = (vint<4> *)
                                    ((ulong)uVar159 *
                                    pGVar10[1].super_RefCount.refCounter.
                                    super___atomic_base<unsigned_long>._M_i);
                          uVar174 = uVar7 & 0x7fff;
                          uVar33 = (ulong)uVar174;
                          uVar176 = uVar8 & 0x7fff;
                          pRVar36 = (RTCIntersectArguments *)(ulong)uVar176;
                          uVar172 = *(uint *)((long)&((Intersectors *)valid_i)->ptr + lVar11 + 4);
                          uVar47 = (ulong)uVar172;
                          uVar51 = (ulong)(uVar172 * uVar176 +
                                          *(int *)((long)&((Intersectors *)valid_i)->ptr + lVar11) +
                                          uVar174);
                          p_Var13 = pGVar10[1].intersectionFilterN;
                          puVar1 = (undefined8 *)(lVar12 + (long)p_Var13 * uVar51);
                          puVar2 = (undefined8 *)(lVar12 + (uVar51 + 1) * (long)p_Var13);
                          lVar15 = uVar51 + uVar47;
                          lVar48 = uVar51 + uVar47 + 1;
                          puVar3 = (undefined8 *)(lVar12 + lVar15 * (long)p_Var13);
                          local_17a8 = *puVar3;
                          uStack_17a0 = puVar3[1];
                          puVar3 = (undefined8 *)(lVar12 + lVar48 * (long)p_Var13);
                          local_1768 = *puVar3;
                          uStack_1760 = puVar3[1];
                          uVar41 = (ulong)(-1 < (short)uVar7);
                          puVar3 = (undefined8 *)(lVar12 + (uVar51 + uVar41 + 1) * (long)p_Var13);
                          lVar42 = uVar41 + lVar48;
                          puVar4 = (undefined8 *)(lVar12 + lVar42 * (long)p_Var13);
                          local_1778 = *puVar4;
                          uStack_1770 = puVar4[1];
                          if ((short)uVar8 < 0) {
                            uVar47 = 0;
                          }
                          puVar4 = (undefined8 *)(lVar12 + (lVar15 + uVar47) * (long)p_Var13);
                          puVar5 = (undefined8 *)(lVar12 + (lVar48 + uVar47) * (long)p_Var13);
                          local_1738 = *puVar5;
                          uStack_1730 = puVar5[1];
                          puVar5 = (undefined8 *)(lVar12 + (uVar47 + lVar42) * (long)p_Var13);
                          lower_x.field_0._0_8_ = *puVar1;
                          lower_x.field_0._8_8_ = puVar1[1];
                          local_1798 = *puVar2;
                          uStack_1790 = puVar2[1];
                          local_1788 = *puVar3;
                          uStack_1780 = puVar3[1];
                          local_1758 = local_17a8;
                          uStack_1750 = uStack_17a0;
                          local_1748 = local_1768;
                          uStack_1740 = uStack_1760;
                          local_1728 = *puVar4;
                          uStack_1720 = puVar4[1];
                          local_1718 = local_1768;
                          uStack_1710 = uStack_1760;
                          local_1708 = local_1778;
                          uStack_1700 = uStack_1770;
                          local_16f8 = *puVar5;
                          uStack_16f0 = puVar5[1];
                          local_16e8 = local_1738;
                          uStack_16e0 = uStack_1730;
                          pfVar50 = (float *)&local_17a8;
                          uVar41 = 0;
                          do {
                            fVar146 = pfVar50[-0xc];
                            fVar151 = pfVar50[-0xb];
                            fVar155 = pfVar50[-10];
                            fVar158 = pfVar50[-7];
                            fVar73 = pfVar50[-6];
                            fVar97 = *pfVar50;
                            fVar110 = pfVar50[1];
                            fVar112 = pfVar50[2];
                            fVar182 = fVar151 - fVar158;
                            fVar186 = fVar151 - fVar158;
                            fVar188 = fVar151 - fVar158;
                            fVar190 = fVar151 - fVar158;
                            fVar76 = fVar155 - fVar73;
                            fVar92 = fVar155 - fVar73;
                            fVar95 = fVar155 - fVar73;
                            fVar96 = fVar155 - fVar73;
                            fVar117 = fVar110 - fVar151;
                            fVar124 = fVar110 - fVar151;
                            fVar126 = fVar110 - fVar151;
                            fVar128 = fVar110 - fVar151;
                            fVar203 = fVar112 - fVar155;
                            fVar205 = fVar112 - fVar155;
                            fVar207 = fVar112 - fVar155;
                            fVar209 = fVar112 - fVar155;
                            fVar162 = fVar76 * fVar117 - fVar182 * fVar203;
                            fVar166 = fVar92 * fVar124 - fVar186 * fVar205;
                            fVar168 = fVar95 * fVar126 - fVar188 * fVar207;
                            fVar169 = fVar96 * fVar128 - fVar190 * fVar209;
                            fVar193 = fVar97 - fVar146;
                            fVar192 = fVar146 - *(float *)*(undefined1 (*) [12])(pfVar50 + -8);
                            fVar171 = fVar192 * fVar203 - fVar76 * fVar193;
                            fVar173 = fVar192 * fVar205 - fVar92 * fVar193;
                            fVar175 = fVar192 * fVar207 - fVar95 * fVar193;
                            fVar177 = fVar192 * fVar209 - fVar96 * fVar193;
                            fVar183 = fVar182 * fVar193 - fVar192 * fVar117;
                            fVar187 = fVar186 * fVar193 - fVar192 * fVar124;
                            fVar189 = fVar188 * fVar193 - fVar192 * fVar126;
                            fVar191 = fVar190 * fVar193 - fVar192 * fVar128;
                            lower_z.field_0._0_8_ = CONCAT44(uVar31,uVar31);
                            lower_z.field_0._8_8_ = CONCAT44(uVar31,uVar31);
                            upper_z.field_0._0_8_ = CONCAT44(uVar159,uVar159);
                            upper_z.field_0._8_8_ = CONCAT44(uVar159,uVar159);
                            fVar114 = *(float *)(ray + 0x10);
                            fVar116 = *(float *)(ray + 0x14);
                            fVar123 = *(float *)(ray + 0x18);
                            fVar125 = *(float *)(ray + 0x1c);
                            fVar211 = fVar151 - fVar114;
                            fVar212 = fVar151 - fVar116;
                            fVar213 = fVar151 - fVar123;
                            fVar151 = fVar151 - fVar125;
                            fVar127 = *(float *)(ray + 0x20);
                            fVar129 = *(float *)(ray + 0x24);
                            fVar132 = *(float *)(ray + 0x28);
                            fVar133 = *(float *)(ray + 0x2c);
                            fVar214 = fVar155 - fVar127;
                            fVar216 = fVar155 - fVar129;
                            fVar218 = fVar155 - fVar132;
                            fVar155 = fVar155 - fVar133;
                            fVar134 = *(float *)(ray + 0x50);
                            fVar135 = *(float *)(ray + 0x54);
                            local_19e8 = *(undefined8 *)(ray + 0x50);
                            fVar140 = *(float *)(ray + 0x58);
                            fVar142 = *(float *)(ray + 0x5c);
                            uStack_19e0 = *(undefined8 *)(ray + 0x58);
                            fVar145 = *(float *)(ray + 0x60);
                            fVar161 = *(float *)(ray + 100);
                            local_19f8 = *(undefined8 *)(ray + 0x60);
                            fVar165 = *(float *)(ray + 0x68);
                            fVar167 = *(float *)(ray + 0x6c);
                            uStack_19f0 = *(undefined8 *)(ray + 0x68);
                            fVar178 = fVar211 * fVar145 - fVar214 * fVar134;
                            fVar179 = fVar212 * fVar161 - fVar216 * fVar135;
                            fVar180 = fVar213 * fVar165 - fVar218 * fVar140;
                            fVar181 = fVar151 * fVar167 - fVar155 * fVar142;
                            fVar194 = *(float *)ray;
                            fVar197 = *(float *)(ray + 4);
                            fVar200 = *(float *)(ray + 8);
                            fVar144 = *(float *)(ray + 0xc);
                            fVar136 = fVar146 - fVar194;
                            fVar141 = fVar146 - fVar197;
                            fVar143 = fVar146 - fVar200;
                            fVar146 = fVar146 - fVar144;
                            fVar196 = *(float *)(ray + 0x40);
                            fVar199 = *(float *)(ray + 0x44);
                            local_19d8 = *(undefined8 *)(ray + 0x40);
                            fVar202 = *(float *)(ray + 0x48);
                            fVar154 = *(float *)(ray + 0x4c);
                            uStack_19d0 = *(undefined8 *)(ray + 0x48);
                            fVar215 = fVar214 * fVar196 - fVar136 * fVar145;
                            fVar217 = fVar216 * fVar199 - fVar141 * fVar161;
                            fVar219 = fVar218 * fVar202 - fVar143 * fVar165;
                            fVar220 = fVar155 * fVar154 - fVar146 * fVar167;
                            fVar98 = fVar136 * fVar134 - fVar211 * fVar196;
                            fVar111 = fVar141 * fVar135 - fVar212 * fVar199;
                            fVar113 = fVar143 * fVar140 - fVar213 * fVar202;
                            fVar115 = fVar146 * fVar142 - fVar151 * fVar154;
                            fVar145 = fVar162 * fVar196 + fVar171 * fVar134 + fVar183 * fVar145;
                            fVar161 = fVar166 * fVar199 + fVar173 * fVar135 + fVar187 * fVar161;
                            fVar165 = fVar168 * fVar202 + fVar175 * fVar140 + fVar189 * fVar165;
                            fVar142 = fVar169 * fVar154 + fVar177 * fVar142 + fVar191 * fVar167;
                            uVar172 = (uint)fVar145 & 0x80000000;
                            uVar153 = (uint)fVar161 & 0x80000000;
                            uVar157 = (uint)fVar165 & 0x80000000;
                            uVar160 = (uint)fVar142 & 0x80000000;
                            fVar167 = (float)((uint)(fVar193 * fVar178 +
                                                    fVar117 * fVar215 + fVar203 * fVar98) ^ uVar172)
                            ;
                            fVar196 = (float)((uint)(fVar193 * fVar179 +
                                                    fVar124 * fVar217 + fVar205 * fVar111) ^ uVar153
                                             );
                            fVar199 = (float)((uint)(fVar193 * fVar180 +
                                                    fVar126 * fVar219 + fVar207 * fVar113) ^ uVar157
                                             );
                            fVar202 = (float)((uint)(fVar193 * fVar181 +
                                                    fVar128 * fVar220 + fVar209 * fVar115) ^ uVar160
                                             );
                            uVar204 = -(uint)(0.0 <= fVar167) & local_1ba8._0_4_;
                            uVar206 = -(uint)(0.0 <= fVar196) & local_1ba8._4_4_;
                            uVar208 = -(uint)(0.0 <= fVar199) & local_1ba8._8_4_;
                            uVar210 = -(uint)(0.0 <= fVar202) & local_1ba8._12_4_;
                            auVar25._4_4_ = uVar206;
                            auVar25._0_4_ = uVar204;
                            auVar25._8_4_ = uVar208;
                            auVar25._12_4_ = uVar210;
                            iVar37 = movmskps((int)uVar33,auVar25);
                            fVar134 = pfVar50[-4];
                            fVar135 = pfVar50[-3];
                            fVar140 = pfVar50[-2];
                            auVar131 = _local_1c08;
                            local_1bd8 = local_1c28;
                            if (iVar37 == 0) {
LAB_00dc1a8f:
                              auVar70._8_8_ = uVar30;
                              auVar70._0_8_ = uVar29;
                              local_1bf8 = local_1be8;
                              uStack_1bf0 = uStack_1be0;
                              auVar131 = _local_1c08;
                              local_1bd8 = local_1c28;
                              fVar96 = local_1b98;
                              fVar98 = fStack_1b94;
                              fVar111 = fStack_1b90;
                              fVar113 = fStack_1b8c;
                              fVar162 = local_1bb8;
                              fVar166 = fStack_1bb4;
                              fVar168 = fStack_1bb0;
                              fVar169 = fStack_1bac;
                            }
                            else {
                              fVar154 = (float)((uint)(fVar192 * fVar178 +
                                                      fVar182 * fVar215 + fVar76 * fVar98) ^ uVar172
                                               );
                              fVar76 = (float)((uint)(fVar192 * fVar179 +
                                                     fVar186 * fVar217 + fVar92 * fVar111) ^ uVar153
                                              );
                              fVar92 = (float)((uint)(fVar192 * fVar180 +
                                                     fVar188 * fVar219 + fVar95 * fVar113) ^ uVar157
                                              );
                              fVar95 = (float)((uint)(fVar192 * fVar181 +
                                                     fVar190 * fVar220 + fVar96 * fVar115) ^ uVar160
                                              );
                              auVar184._0_4_ = -(uint)(0.0 <= fVar154) & uVar204;
                              auVar184._4_4_ = -(uint)(0.0 <= fVar76) & uVar206;
                              auVar184._8_4_ = -(uint)(0.0 <= fVar92) & uVar208;
                              auVar184._12_4_ = -(uint)(0.0 <= fVar95) & uVar210;
                              iVar37 = movmskps(iVar37,auVar184);
                              if (iVar37 == 0) goto LAB_00dc1a8f;
                              fVar96 = ABS(fVar145);
                              fVar98 = ABS(fVar161);
                              fVar111 = ABS(fVar165);
                              fVar113 = ABS(fVar142);
                              auVar106._0_4_ = -(uint)(fVar154 <= fVar96 - fVar167) & auVar184._0_4_
                              ;
                              auVar106._4_4_ = -(uint)(fVar76 <= fVar98 - fVar196) & auVar184._4_4_;
                              auVar106._8_4_ = -(uint)(fVar92 <= fVar111 - fVar199) & auVar184._8_4_
                              ;
                              auVar106._12_4_ =
                                   -(uint)(fVar95 <= fVar113 - fVar202) & auVar184._12_4_;
                              iVar37 = movmskps(iVar37,auVar106);
                              local_1bf8 = local_1be8;
                              uStack_1bf0 = uStack_1be0;
                              if (iVar37 == 0) {
                                auVar70._8_8_ = uVar30;
                                auVar70._0_8_ = uVar29;
                                iVar37 = 0;
                                fVar96 = local_1b98;
                                fVar98 = fStack_1b94;
                                fVar111 = fStack_1b90;
                                fVar113 = fStack_1b8c;
                                fVar162 = local_1bb8;
                                fVar166 = fStack_1bb4;
                                fVar168 = fStack_1bb0;
                                fVar169 = fStack_1bac;
                              }
                              else {
                                fVar115 = (float)(uVar172 ^
                                                 (uint)(fVar136 * fVar162 +
                                                       fVar211 * fVar171 + fVar214 * fVar183));
                                fVar117 = (float)(uVar153 ^
                                                 (uint)(fVar141 * fVar166 +
                                                       fVar212 * fVar173 + fVar216 * fVar187));
                                fVar124 = (float)(uVar157 ^
                                                 (uint)(fVar143 * fVar168 +
                                                       fVar213 * fVar175 + fVar218 * fVar189));
                                fVar146 = (float)(uVar160 ^
                                                 (uint)(fVar146 * fVar169 +
                                                       fVar151 * fVar177 + fVar155 * fVar191));
                                local_1bf8 = CONCAT44(fVar117,fVar115);
                                uStack_1bf0 = CONCAT44(fVar146,fVar124);
                                auVar139._0_4_ =
                                     -(uint)(fVar115 <= *(float *)(ray + 0x80) * fVar96 &&
                                            *(float *)(ray + 0x30) * fVar96 < fVar115) &
                                     auVar106._0_4_;
                                auVar139._4_4_ =
                                     -(uint)(fVar117 <= *(float *)(ray + 0x84) * fVar98 &&
                                            *(float *)(ray + 0x34) * fVar98 < fVar117) &
                                     auVar106._4_4_;
                                auVar139._8_4_ =
                                     -(uint)(fVar124 <= *(float *)(ray + 0x88) * fVar111 &&
                                            *(float *)(ray + 0x38) * fVar111 < fVar124) &
                                     auVar106._8_4_;
                                auVar139._12_4_ =
                                     -(uint)(fVar146 <= *(float *)(ray + 0x8c) * fVar113 &&
                                            *(float *)(ray + 0x3c) * fVar113 < fVar146) &
                                     auVar106._12_4_;
                                iVar37 = movmskps(iVar37,auVar139);
                                if (iVar37 == 0) {
                                  auVar70._8_8_ = uVar30;
                                  auVar70._0_8_ = uVar29;
                                  local_1bf8 = local_1be8;
                                  uStack_1bf0 = uStack_1be0;
                                  iVar37 = 0;
                                  fVar96 = local_1b98;
                                  fVar98 = fStack_1b94;
                                  fVar111 = fStack_1b90;
                                  fVar113 = fStack_1b8c;
                                  fVar162 = local_1bb8;
                                  fVar166 = fStack_1bb4;
                                  fVar168 = fStack_1bb0;
                                  fVar169 = fStack_1bac;
                                }
                                else {
                                  local_1bd8._4_4_ = fVar76;
                                  local_1bd8._0_4_ = fVar154;
                                  local_1bd8._8_4_ = fVar92;
                                  local_1bd8._12_4_ = fVar95;
                                  auVar70._0_4_ = -(uint)(fVar145 != 0.0) & auVar139._0_4_;
                                  auVar70._4_4_ = -(uint)(fVar161 != 0.0) & auVar139._4_4_;
                                  auVar70._8_4_ = -(uint)(fVar165 != 0.0) & auVar139._8_4_;
                                  auVar70._12_4_ = -(uint)(fVar142 != 0.0) & auVar139._12_4_;
                                  iVar37 = movmskps(iVar37,auVar70);
                                  auVar131._4_4_ = fVar196;
                                  auVar131._0_4_ = fVar167;
                                  auVar131._8_4_ = fVar199;
                                  auVar131._12_4_ = fVar202;
                                  if (iVar37 == 0) goto LAB_00dc1a8f;
                                }
                              }
                            }
                            local_1bc8 = SUB124(*(undefined1 (*) [12])(pfVar50 + -8),0);
                            iVar37 = movmskps(iVar37,auVar70);
                            if (iVar37 == 0) {
                              uVar172 = 0;
                              _local_1be8 = auVar131;
                            }
                            else {
                              fVar146 = (float)(int)(*(ushort *)
                                                      ((long)&((Intersectors *)valid_i)->
                                                              leafIntersector + lVar11) - 1);
                              auVar118 = rcpss(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146));
                              fVar155 = (2.0 - fVar146 * auVar118._0_4_) * auVar118._0_4_;
                              fVar146 = (float)(int)(*(ushort *)
                                                      ((long)&((Intersectors *)valid_i)->
                                                              leafIntersector + lVar11 + 2) - 1);
                              auVar118 = rcpss(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146));
                              fVar151 = (float)(((uint)uVar41 & 1) + uVar174);
                              auVar149._0_4_ = fVar155 * (fVar151 * fVar96 + auVar131._0_4_);
                              auVar149._4_4_ = fVar155 * (fVar151 * fVar98 + auVar131._4_4_);
                              auVar149._8_4_ = fVar155 * (fVar151 * fVar111 + auVar131._8_4_);
                              auVar149._12_4_ = fVar155 * (fVar151 * fVar113 + auVar131._12_4_);
                              _local_1be8 = blendvps(auVar131,auVar149,auVar70);
                              fVar151 = (2.0 - fVar146 * auVar118._0_4_) * auVar118._0_4_;
                              fVar146 = (float)(int)(((uint)(uVar41 >> 1) & 0x7fffffff) + uVar176);
                              auVar24._4_4_ = fVar151 * (fVar146 * fVar98 + local_1bd8._4_4_);
                              auVar24._0_4_ = fVar151 * (fVar146 * fVar96 + local_1bd8._0_4_);
                              auVar24._8_4_ = fVar151 * (fVar146 * fVar111 + local_1bd8._8_4_);
                              auVar24._12_4_ = fVar151 * (fVar146 * fVar113 + local_1bd8._12_4_);
                              local_1bd8 = blendvps(local_1bd8,auVar24,auVar70);
                              uVar172 = lower_z.field_0.i[uVar41];
                              pRVar14 = (context->scene->geometries).items;
                              pGVar10 = pRVar14[uVar172].ptr;
                              uVar153 = pGVar10->mask;
                              auVar102._0_4_ = -(uint)((uVar153 & *(uint *)(ray + 0x90)) == 0);
                              auVar102._4_4_ = -(uint)((uVar153 & *(uint *)(ray + 0x94)) == 0);
                              auVar102._8_4_ = -(uint)((uVar153 & *(uint *)(ray + 0x98)) == 0);
                              auVar102._12_4_ = -(uint)((uVar153 & *(uint *)(ray + 0x9c)) == 0);
                              aVar100 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                        (~auVar102 & auVar70);
                              uVar153 = movmskps((int)pRVar14,(undefined1  [16])aVar100);
                              pRVar36 = (RTCIntersectArguments *)(ulong)uVar153;
                              if (uVar153 != 0) {
                                pRVar36 = (RTCIntersectArguments *)
                                          (ulong)(uint)upper_z.field_0.i[uVar41];
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  auVar27._4_4_ = fVar98;
                                  auVar27._0_4_ = fVar96;
                                  auVar27._8_4_ = fVar111;
                                  auVar27._12_4_ = fVar113;
                                  auVar118 = rcpps(auVar70,auVar27);
                                  fVar146 = auVar118._0_4_;
                                  fVar151 = auVar118._4_4_;
                                  fVar155 = auVar118._8_4_;
                                  fVar114 = auVar118._12_4_;
                                  upper_x.field_0.v[0] = fVar162;
                                  upper_x.field_0.v[1] = fVar166;
                                  upper_x.field_0.v[2] = fVar168;
                                  upper_x.field_0.v[3] = fVar169;
                                  auVar81._0_4_ =
                                       ((1.0 - fVar96 * fVar146) * fVar146 + fVar146) *
                                       (float)local_1bf8;
                                  auVar81._4_4_ =
                                       ((1.0 - fVar98 * fVar151) * fVar151 + fVar151) *
                                       local_1bf8._4_4_;
                                  auVar81._8_4_ =
                                       ((1.0 - fVar111 * fVar155) * fVar155 + fVar155) *
                                       (float)uStack_1bf0;
                                  auVar81._12_4_ =
                                       ((1.0 - fVar113 * fVar114) * fVar114 + fVar114) *
                                       uStack_1bf0._4_4_;
                                  auVar118 = *(undefined1 (*) [16])(ray + 0x80);
                                  auVar122 = blendvps(auVar118,auVar81,(undefined1  [16])aVar100);
                                  *(undefined1 (*) [16])(ray + 0x80) = auVar122;
                                  upper_y.field_0 = aVar100;
                                  lower_y.field_0._0_8_ = &upper_y;
                                  lower_y.field_0._8_8_ = pGVar10->userPtr;
                                  pRVar34 = (RayK<4> *)pGVar10->occlusionFilterN;
                                  if (pRVar34 != (RayK<4> *)0x0) {
                                    pRVar34 = (RayK<4> *)(*(code *)pRVar34)(&lower_y);
                                  }
                                  if (upper_y.field_0 ==
                                      (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0) {
                                    auVar82._8_4_ = 0xffffffff;
                                    auVar82._0_8_ = 0xffffffffffffffff;
                                    auVar82._12_4_ = 0xffffffff;
                                    auVar82 = auVar82 ^ _DAT_01f7ae20;
                                  }
                                  else {
                                    pRVar36 = context->args;
                                    if ((pRVar36->filter != (RTCFilterFunctionN)0x0) &&
                                       (((pRVar36->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                         ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*pRVar36->filter)((RTCFilterFunctionNArguments *)&lower_y);
                                    }
                                    auVar105._0_4_ = -(uint)(upper_y.field_0._0_4_ == 0);
                                    auVar105._4_4_ = -(uint)(upper_y.field_0._4_4_ == 0);
                                    auVar105._8_4_ = -(uint)(upper_y.field_0._8_4_ == 0);
                                    auVar105._12_4_ = -(uint)(upper_y.field_0._12_4_ == 0);
                                    auVar82 = auVar105 ^ _DAT_01f7ae20;
                                    auVar122 = blendvps(_DAT_01f7aa00,
                                                        *(undefined1 (*) [16])(ray + 0x80),auVar105)
                                    ;
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar122;
                                    pRVar34 = ray;
                                  }
                                  uVar172 = (uint)pRVar34;
                                  auVar84._0_4_ = auVar82._0_4_ << 0x1f;
                                  auVar84._4_4_ = auVar82._4_4_ << 0x1f;
                                  auVar84._8_4_ = auVar82._8_4_ << 0x1f;
                                  auVar84._12_4_ = auVar82._12_4_ << 0x1f;
                                  auVar118 = blendvps(auVar118,*(undefined1 (*) [16])(ray + 0x80),
                                                      auVar84);
                                  aVar100._0_4_ = auVar84._0_4_ >> 0x1f;
                                  aVar100._4_4_ = auVar84._4_4_ >> 0x1f;
                                  aVar100._8_4_ = auVar84._8_4_ >> 0x1f;
                                  aVar100._12_4_ = auVar84._12_4_ >> 0x1f;
                                  *(undefined1 (*) [16])(ray + 0x80) = auVar118;
                                  fVar194 = *(float *)ray;
                                  fVar197 = *(float *)(ray + 4);
                                  fVar200 = *(float *)(ray + 8);
                                  fVar144 = *(float *)(ray + 0xc);
                                  fVar114 = *(float *)(ray + 0x10);
                                  fVar116 = *(float *)(ray + 0x14);
                                  fVar123 = *(float *)(ray + 0x18);
                                  fVar125 = *(float *)(ray + 0x1c);
                                  fVar127 = *(float *)(ray + 0x20);
                                  fVar129 = *(float *)(ray + 0x24);
                                  fVar132 = *(float *)(ray + 0x28);
                                  fVar133 = *(float *)(ray + 0x2c);
                                  local_19d8 = *(undefined8 *)(ray + 0x40);
                                  uStack_19d0 = *(undefined8 *)(ray + 0x48);
                                  local_19e8 = *(undefined8 *)(ray + 0x50);
                                  uStack_19e0 = *(undefined8 *)(ray + 0x58);
                                  local_19f8 = *(undefined8 *)(ray + 0x60);
                                  uStack_19f0 = *(undefined8 *)(ray + 0x68);
                                }
                                local_1ba8._4_4_ = ~aVar100.i[1] & local_1ba8._4_4_;
                                local_1ba8._0_4_ = ~aVar100.i[0] & local_1ba8._0_4_;
                                local_1ba8._8_4_ = ~aVar100.i[2] & local_1ba8._8_4_;
                                local_1ba8._12_4_ = ~aVar100.i[3] & local_1ba8._12_4_;
                              }
                            }
                            fVar146 = fVar134 - fVar97;
                            fVar151 = fVar134 - fVar97;
                            fVar155 = fVar134 - fVar97;
                            fVar97 = fVar134 - fVar97;
                            fVar186 = fVar135 - fVar110;
                            fVar187 = fVar135 - fVar110;
                            fVar188 = fVar135 - fVar110;
                            fVar110 = fVar135 - fVar110;
                            fVar142 = fVar140 - fVar112;
                            fVar145 = fVar140 - fVar112;
                            fVar161 = fVar140 - fVar112;
                            fVar112 = fVar140 - fVar112;
                            fVar165 = local_1bc8 - fVar134;
                            fVar167 = local_1bc8 - fVar134;
                            fVar196 = local_1bc8 - fVar134;
                            local_1bc8 = local_1bc8 - fVar134;
                            fVar143 = fVar158 - fVar135;
                            fVar171 = fVar158 - fVar135;
                            fVar173 = fVar158 - fVar135;
                            fVar158 = fVar158 - fVar135;
                            fVar189 = fVar73 - fVar140;
                            fVar190 = fVar73 - fVar140;
                            fVar191 = fVar73 - fVar140;
                            fVar73 = fVar73 - fVar140;
                            local_1bb8 = fVar143 * fVar142 - fVar189 * fVar186;
                            fStack_1bb4 = fVar171 * fVar145 - fVar190 * fVar187;
                            fStack_1bb0 = fVar173 * fVar161 - fVar191 * fVar188;
                            fStack_1bac = fVar158 * fVar112 - fVar73 * fVar110;
                            fVar175 = fVar189 * fVar146 - fVar165 * fVar142;
                            fVar177 = fVar190 * fVar151 - fVar167 * fVar145;
                            fVar178 = fVar191 * fVar155 - fVar196 * fVar161;
                            fVar179 = fVar73 * fVar97 - local_1bc8 * fVar112;
                            fVar180 = fVar165 * fVar186 - fVar143 * fVar146;
                            fVar181 = fVar167 * fVar187 - fVar171 * fVar151;
                            fVar182 = fVar196 * fVar188 - fVar173 * fVar155;
                            fVar183 = local_1bc8 * fVar110 - fVar158 * fVar97;
                            fVar194 = fVar134 - fVar194;
                            fVar197 = fVar134 - fVar197;
                            fVar200 = fVar134 - fVar200;
                            fVar134 = fVar134 - fVar144;
                            fVar114 = fVar135 - fVar114;
                            fVar116 = fVar135 - fVar116;
                            fVar123 = fVar135 - fVar123;
                            fVar135 = fVar135 - fVar125;
                            fVar127 = fVar140 - fVar127;
                            fVar129 = fVar140 - fVar129;
                            fVar132 = fVar140 - fVar132;
                            fVar140 = fVar140 - fVar133;
                            fVar125 = fVar114 * (float)local_19f8 - fVar127 * (float)local_19e8;
                            fVar133 = fVar116 * local_19f8._4_4_ - fVar129 * local_19e8._4_4_;
                            fVar144 = fVar123 * (float)uStack_19f0 - fVar132 * (float)uStack_19e0;
                            fVar199 = fVar135 * uStack_19f0._4_4_ - fVar140 * uStack_19e0._4_4_;
                            fVar202 = fVar127 * (float)local_19d8 - fVar194 * (float)local_19f8;
                            fVar154 = fVar129 * local_19d8._4_4_ - fVar197 * local_19f8._4_4_;
                            fVar76 = fVar132 * (float)uStack_19d0 - fVar200 * (float)uStack_19f0;
                            fVar92 = fVar140 * uStack_19d0._4_4_ - fVar134 * uStack_19f0._4_4_;
                            fVar95 = fVar194 * (float)local_19e8 - fVar114 * (float)local_19d8;
                            fVar115 = fVar197 * local_19e8._4_4_ - fVar116 * local_19d8._4_4_;
                            fVar117 = fVar200 * (float)uStack_19e0 - fVar123 * (float)uStack_19d0;
                            fVar124 = fVar134 * uStack_19e0._4_4_ - fVar135 * uStack_19d0._4_4_;
                            fVar126 = (float)local_19d8 * local_1bb8 +
                                      (float)local_19e8 * fVar175 + (float)local_19f8 * fVar180;
                            fVar128 = local_19d8._4_4_ * fStack_1bb4 +
                                      local_19e8._4_4_ * fVar177 + local_19f8._4_4_ * fVar181;
                            fVar136 = (float)uStack_19d0 * fStack_1bb0 +
                                      (float)uStack_19e0 * fVar178 + (float)uStack_19f0 * fVar182;
                            fVar141 = uStack_19d0._4_4_ * fStack_1bac +
                                      uStack_19e0._4_4_ * fVar179 + uStack_19f0._4_4_ * fVar183;
                            uVar153 = (uint)fVar126 & 0x80000000;
                            uVar157 = (uint)fVar128 & 0x80000000;
                            uVar160 = (uint)fVar136 & 0x80000000;
                            uVar204 = (uint)fVar141 & 0x80000000;
                            local_1c08._0_4_ =
                                 (uint)(fVar165 * fVar125 + fVar143 * fVar202 + fVar189 * fVar95) ^
                                 uVar153;
                            local_1c08._4_4_ =
                                 (uint)(fVar167 * fVar133 + fVar171 * fVar154 + fVar190 * fVar115) ^
                                 uVar157;
                            fStack_1c00 = (float)((uint)(fVar196 * fVar144 +
                                                        fVar173 * fVar76 + fVar191 * fVar117) ^
                                                 uVar160);
                            fStack_1bfc = (float)((uint)(local_1bc8 * fVar199 +
                                                        fVar158 * fVar92 + fVar73 * fVar124) ^
                                                 uVar204);
                            auVar120._0_4_ =
                                 -(uint)(0.0 <= (float)local_1c08._0_4_) & local_1ba8._0_4_;
                            auVar120._4_4_ =
                                 -(uint)(0.0 <= (float)local_1c08._4_4_) & local_1ba8._4_4_;
                            auVar120._8_4_ = -(uint)(0.0 <= fStack_1c00) & local_1ba8._8_4_;
                            auVar120._12_4_ = -(uint)(0.0 <= fStack_1bfc) & local_1ba8._12_4_;
                            iVar37 = movmskps(uVar172,auVar120);
                            if (iVar37 == 0) {
LAB_00dc1dd5:
                              auVar69._8_8_ = uVar30;
                              auVar69._0_8_ = uVar29;
                              _local_1c08 = _local_1be8;
                              local_1c28 = local_1bd8;
                              local_1bb8 = fVar162;
                              fStack_1bb4 = fVar166;
                              fStack_1bb0 = fVar168;
                              fStack_1bac = fVar169;
                              fVar146 = (float)local_1bf8;
                              fVar151 = local_1bf8._4_4_;
                              fVar155 = (float)uStack_1bf0;
                              fVar158 = uStack_1bf0._4_4_;
                              local_1b98 = fVar96;
                              fStack_1b94 = fVar98;
                              fStack_1b90 = fVar111;
                              fStack_1b8c = fVar113;
                            }
                            else {
                              local_1c28._0_4_ =
                                   (float)((uint)(fVar146 * fVar125 +
                                                 fVar186 * fVar202 + fVar142 * fVar95) ^ uVar153);
                              local_1c28._4_4_ =
                                   (float)((uint)(fVar151 * fVar133 +
                                                 fVar187 * fVar154 + fVar145 * fVar115) ^ uVar157);
                              local_1c28._8_4_ =
                                   (float)((uint)(fVar155 * fVar144 +
                                                 fVar188 * fVar76 + fVar161 * fVar117) ^ uVar160);
                              local_1c28._12_4_ =
                                   (float)((uint)(fVar97 * fVar199 +
                                                 fVar110 * fVar92 + fVar112 * fVar124) ^ uVar204);
                              auVar107._0_4_ = -(uint)(0.0 <= local_1c28._0_4_) & auVar120._0_4_;
                              auVar107._4_4_ = -(uint)(0.0 <= local_1c28._4_4_) & auVar120._4_4_;
                              auVar107._8_4_ = -(uint)(0.0 <= local_1c28._8_4_) & auVar120._8_4_;
                              auVar107._12_4_ = -(uint)(0.0 <= local_1c28._12_4_) & auVar120._12_4_;
                              iVar37 = movmskps(iVar37,auVar107);
                              if (iVar37 == 0) goto LAB_00dc1dd5;
                              local_1b98 = ABS(fVar126);
                              fStack_1b94 = ABS(fVar128);
                              fStack_1b90 = ABS(fVar136);
                              fStack_1b8c = ABS(fVar141);
                              auVar68._0_4_ =
                                   -(uint)(local_1c28._0_4_ <= local_1b98 - (float)local_1c08._0_4_)
                                   & auVar107._0_4_;
                              auVar68._4_4_ =
                                   -(uint)(local_1c28._4_4_ <= fStack_1b94 - (float)local_1c08._4_4_
                                          ) & auVar107._4_4_;
                              auVar68._8_4_ =
                                   -(uint)(local_1c28._8_4_ <= fStack_1b90 - fStack_1c00) &
                                   auVar107._8_4_;
                              auVar68._12_4_ =
                                   -(uint)(local_1c28._12_4_ <= fStack_1b8c - fStack_1bfc) &
                                   auVar107._12_4_;
                              iVar37 = movmskps(iVar37,auVar68);
                              if (iVar37 == 0) goto LAB_00dc1dd5;
                              fVar146 = (float)(uVar153 ^
                                               (uint)(fVar194 * local_1bb8 +
                                                     fVar114 * fVar175 + fVar127 * fVar180));
                              fVar151 = (float)(uVar157 ^
                                               (uint)(fVar197 * fStack_1bb4 +
                                                     fVar116 * fVar177 + fVar129 * fVar181));
                              fVar155 = (float)(uVar160 ^
                                               (uint)(fVar200 * fStack_1bb0 +
                                                     fVar123 * fVar178 + fVar132 * fVar182));
                              fVar158 = (float)(uVar204 ^
                                               (uint)(fVar134 * fStack_1bac +
                                                     fVar135 * fVar179 + fVar140 * fVar183));
                              auVar108._0_4_ =
                                   -(uint)(fVar146 <= *(float *)(ray + 0x80) * local_1b98 &&
                                          *(float *)(ray + 0x30) * local_1b98 < fVar146) &
                                   auVar68._0_4_;
                              auVar108._4_4_ =
                                   -(uint)(fVar151 <= *(float *)(ray + 0x84) * fStack_1b94 &&
                                          *(float *)(ray + 0x34) * fStack_1b94 < fVar151) &
                                   auVar68._4_4_;
                              auVar108._8_4_ =
                                   -(uint)(fVar155 <= *(float *)(ray + 0x88) * fStack_1b90 &&
                                          *(float *)(ray + 0x38) * fStack_1b90 < fVar155) &
                                   auVar68._8_4_;
                              auVar108._12_4_ =
                                   -(uint)(fVar158 <= *(float *)(ray + 0x8c) * fStack_1b8c &&
                                          *(float *)(ray + 0x3c) * fStack_1b8c < fVar158) &
                                   auVar68._12_4_;
                              iVar37 = movmskps(iVar37,auVar108);
                              if (iVar37 == 0) {
                                auVar69._8_8_ = uVar30;
                                auVar69._0_8_ = uVar29;
                                iVar37 = 0;
                                _local_1c08 = _local_1be8;
                                local_1c28 = local_1bd8;
                                local_1bb8 = fVar162;
                                fStack_1bb4 = fVar166;
                                fStack_1bb0 = fVar168;
                                fStack_1bac = fVar169;
                                fVar146 = (float)local_1bf8;
                                fVar151 = local_1bf8._4_4_;
                                fVar155 = (float)uStack_1bf0;
                                fVar158 = uStack_1bf0._4_4_;
                                local_1b98 = fVar96;
                                fStack_1b94 = fVar98;
                                fStack_1b90 = fVar111;
                                fStack_1b8c = fVar113;
                              }
                              else {
                                auVar69._0_4_ = -(uint)(fVar126 != 0.0) & auVar108._0_4_;
                                auVar69._4_4_ = -(uint)(fVar128 != 0.0) & auVar108._4_4_;
                                auVar69._8_4_ = -(uint)(fVar136 != 0.0) & auVar108._8_4_;
                                auVar69._12_4_ = -(uint)(fVar141 != 0.0) & auVar108._12_4_;
                                iVar37 = movmskps(iVar37,auVar69);
                                _local_1c08 = _local_1c08;
                                if (iVar37 == 0) goto LAB_00dc1dd5;
                              }
                            }
                            uVar172 = movmskps(iVar37,auVar69);
                            local_1be8._4_4_ = fVar151;
                            local_1be8._0_4_ = fVar146;
                            uStack_1be0._0_4_ = fVar155;
                            uStack_1be0._4_4_ = fVar158;
                            if (uVar172 != 0) {
                              fVar73 = local_1b98 - local_1c08._0_4_;
                              fVar97 = fStack_1b94 - local_1c08._4_4_;
                              auVar130._4_4_ = fVar97;
                              auVar130._0_4_ = fVar73;
                              fVar110 = fStack_1b90 - local_1c08._8_4_;
                              fVar112 = fStack_1b8c - local_1c08._12_4_;
                              fVar114 = local_1b98 - local_1c28._0_4_;
                              fVar116 = fStack_1b94 - local_1c28._4_4_;
                              auVar150._4_4_ = fVar116;
                              auVar150._0_4_ = fVar114;
                              fVar123 = fStack_1b90 - local_1c28._8_4_;
                              fVar125 = fStack_1b8c - local_1c28._12_4_;
                              fVar127 = (float)(int)(*(ushort *)
                                                      ((long)&((Intersectors *)valid_i)->
                                                              leafIntersector + lVar11) - 1);
                              auVar118 = rcpss(ZEXT416((uint)fVar127),ZEXT416((uint)fVar127));
                              fVar129 = (float)(int)(*(ushort *)
                                                      ((long)&((Intersectors *)valid_i)->
                                                              leafIntersector + lVar11 + 2) - 1);
                              fVar132 = (2.0 - fVar127 * auVar118._0_4_) * auVar118._0_4_;
                              auVar118 = rcpss(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129));
                              fVar127 = (2.0 - fVar129 * auVar118._0_4_) * auVar118._0_4_;
                              fVar129 = (float)(((uint)uVar41 & 1) + uVar174);
                              auVar138._0_4_ = fVar132 * (fVar129 * local_1b98 + fVar73);
                              auVar138._4_4_ = fVar132 * (fVar129 * fStack_1b94 + fVar97);
                              auVar138._8_4_ = fVar132 * (fVar129 * fStack_1b90 + fVar110);
                              auVar138._12_4_ = fVar132 * (fVar129 * fStack_1b8c + fVar112);
                              auVar130._8_4_ = fVar110;
                              auVar130._12_4_ = fVar112;
                              _local_1c08 = blendvps(auVar130,auVar138,auVar69);
                              fVar73 = (float)(int)(((uint)(uVar41 >> 1) & 0x7fffffff) + uVar176);
                              auVar121._0_4_ = fVar127 * (fVar73 * local_1b98 + fVar114);
                              auVar121._4_4_ = fVar127 * (fVar73 * fStack_1b94 + fVar116);
                              auVar121._8_4_ = fVar127 * (fVar73 * fStack_1b90 + fVar123);
                              auVar121._12_4_ = fVar127 * (fVar73 * fStack_1b8c + fVar125);
                              auVar150._8_4_ = fVar123;
                              auVar150._12_4_ = fVar125;
                              local_1c28 = blendvps(auVar150,auVar121,auVar69);
                              uVar172 = lower_z.field_0.i[uVar41];
                              pRVar14 = (context->scene->geometries).items;
                              pGVar10 = pRVar14[uVar172].ptr;
                              uVar153 = pGVar10->mask;
                              auVar103._0_4_ = -(uint)((uVar153 & *(uint *)(ray + 0x90)) == 0);
                              auVar103._4_4_ = -(uint)((uVar153 & *(uint *)(ray + 0x94)) == 0);
                              auVar103._8_4_ = -(uint)((uVar153 & *(uint *)(ray + 0x98)) == 0);
                              auVar103._12_4_ = -(uint)((uVar153 & *(uint *)(ray + 0x9c)) == 0);
                              aVar104 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                        (~auVar103 & auVar69);
                              uVar153 = movmskps((int)pRVar14,(undefined1  [16])aVar104);
                              pRVar36 = (RTCIntersectArguments *)(ulong)uVar153;
                              if (uVar153 != 0) {
                                pRVar36 = (RTCIntersectArguments *)
                                          (ulong)(uint)upper_z.field_0.i[uVar41];
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  auVar26._4_4_ = fStack_1b94;
                                  auVar26._0_4_ = local_1b98;
                                  auVar26._8_4_ = fStack_1b90;
                                  auVar26._12_4_ = fStack_1b8c;
                                  auVar118 = rcpps(auVar69,auVar26);
                                  fVar73 = auVar118._0_4_;
                                  fVar97 = auVar118._4_4_;
                                  fVar110 = auVar118._8_4_;
                                  fVar112 = auVar118._12_4_;
                                  upper_x.field_0.v[0] = local_1bb8;
                                  upper_x.field_0.v[1] = fStack_1bb4;
                                  upper_x.field_0.v[2] = fStack_1bb0;
                                  upper_x.field_0.v[3] = fStack_1bac;
                                  auVar83._0_4_ =
                                       ((1.0 - local_1b98 * fVar73) * fVar73 + fVar73) * fVar146;
                                  auVar83._4_4_ =
                                       ((1.0 - fStack_1b94 * fVar97) * fVar97 + fVar97) * fVar151;
                                  auVar83._8_4_ =
                                       ((1.0 - fStack_1b90 * fVar110) * fVar110 + fVar110) * fVar155
                                  ;
                                  auVar83._12_4_ =
                                       ((1.0 - fStack_1b8c * fVar112) * fVar112 + fVar112) * fVar158
                                  ;
                                  auVar118 = *(undefined1 (*) [16])(ray + 0x80);
                                  auVar122 = blendvps(auVar118,auVar83,(undefined1  [16])aVar104);
                                  *(undefined1 (*) [16])(ray + 0x80) = auVar122;
                                  upper_y.field_0 = aVar104;
                                  lower_y.field_0._0_8_ = &upper_y;
                                  lower_y.field_0._8_8_ = pGVar10->userPtr;
                                  pRVar34 = (RayK<4> *)pGVar10->occlusionFilterN;
                                  if (pRVar34 != (RayK<4> *)0x0) {
                                    pRVar34 = (RayK<4> *)(*(code *)pRVar34)(&lower_y);
                                  }
                                  if (upper_y.field_0 ==
                                      (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0) {
                                    auVar85._8_4_ = 0xffffffff;
                                    auVar85._0_8_ = 0xffffffffffffffff;
                                    auVar85._12_4_ = 0xffffffff;
                                    auVar85 = auVar85 ^ _DAT_01f7ae20;
                                  }
                                  else {
                                    pRVar36 = context->args;
                                    if ((pRVar36->filter != (RTCFilterFunctionN)0x0) &&
                                       (((pRVar36->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                         ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*pRVar36->filter)((RTCFilterFunctionNArguments *)&lower_y);
                                    }
                                    auVar109._0_4_ = -(uint)(upper_y.field_0._0_4_ == 0);
                                    auVar109._4_4_ = -(uint)(upper_y.field_0._4_4_ == 0);
                                    auVar109._8_4_ = -(uint)(upper_y.field_0._8_4_ == 0);
                                    auVar109._12_4_ = -(uint)(upper_y.field_0._12_4_ == 0);
                                    auVar85 = auVar109 ^ _DAT_01f7ae20;
                                    auVar122 = blendvps(_DAT_01f7aa00,
                                                        *(undefined1 (*) [16])(ray + 0x80),auVar109)
                                    ;
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar122;
                                    pRVar34 = ray;
                                  }
                                  uVar172 = (uint)pRVar34;
                                  auVar86._0_4_ = auVar85._0_4_ << 0x1f;
                                  auVar86._4_4_ = auVar85._4_4_ << 0x1f;
                                  auVar86._8_4_ = auVar85._8_4_ << 0x1f;
                                  auVar86._12_4_ = auVar85._12_4_ << 0x1f;
                                  aVar104._0_4_ = auVar86._0_4_ >> 0x1f;
                                  aVar104._4_4_ = auVar86._4_4_ >> 0x1f;
                                  aVar104._8_4_ = auVar86._8_4_ >> 0x1f;
                                  aVar104._12_4_ = auVar86._12_4_ >> 0x1f;
                                  auVar118 = blendvps(auVar118,*(undefined1 (*) [16])(ray + 0x80),
                                                      auVar86);
                                  *(undefined1 (*) [16])(ray + 0x80) = auVar118;
                                }
                                local_1ba8 = ~(undefined1  [16])aVar104 & local_1ba8;
                              }
                            }
                            iVar201 = 0x7f800000;
                            iVar198 = 0x7f800000;
                            iVar195 = 0x7f800000;
                            iVar37 = 0x7f800000;
                            uVar172 = movmskps(uVar172,local_1ba8);
                            uVar33 = (ulong)uVar172;
                            if (uVar172 == 0) break;
                            uVar33 = uVar41 + 1;
                            pfVar50 = pfVar50 + 0x10;
                            bVar54 = uVar41 < 3;
                            uVar41 = uVar33;
                          } while (bVar54);
                          auVar185._0_4_ = uVar147 & local_1ba8._0_4_;
                          auVar185._4_4_ = uVar170 & local_1ba8._4_4_;
                          auVar185._8_4_ = uVar152 & local_1ba8._8_4_;
                          auVar185._12_4_ = uVar156 & local_1ba8._12_4_;
                          iVar32 = movmskps((int)uVar33,auVar185);
                          bVar54 = iVar32 == 0;
                          local_1ba8 = auVar185;
                        }
                      } while ((!bVar54) && (uVar46 = uVar46 & uVar46 - 1, uVar46 != 0));
                    }
                    lVar39 = lVar39 + 1;
                  } while (lVar39 != uVar52 - 8);
                  aVar71._0_8_ = local_1ba8._0_8_ ^ 0xffffffffffffffff;
                  aVar71._8_4_ = local_1ba8._8_4_ ^ 0xffffffff;
                  aVar71._12_4_ = local_1ba8._12_4_ ^ 0xffffffff;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])terminated.field_0 | (undefined1  [16])aVar71);
                uVar31 = movmskps((int)lVar39,(undefined1  [16])terminated.field_0);
                if (uVar31 == 0xf) goto LAB_00dc29de;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_00dc1205;
            }
            pRVar36 = (RTCIntersectArguments *)(root.ptr & 0xfffffffffffffff0);
            lVar39 = 0;
            aVar79.i[1] = iVar195;
            aVar79.i[0] = iVar37;
            aVar79.i[2] = iVar198;
            aVar79.i[3] = iVar201;
            sVar45 = 8;
            do {
              sVar9 = *(size_t *)(&pRVar36->flags + lVar39 * 2);
              sVar43 = sVar45;
              if (sVar9 == 8) break;
              fVar146 = *(float *)(root.ptr + 0x20 + lVar39 * 4);
              fVar151 = *(float *)(root.ptr + 0x30 + lVar39 * 4);
              fVar155 = *(float *)(root.ptr + 0x40 + lVar39 * 4);
              fVar158 = *(float *)(root.ptr + 0x50 + lVar39 * 4);
              fVar116 = (fVar146 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar123 = (fVar146 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar125 = (fVar146 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar127 = (fVar146 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_
              ;
              fVar129 = (fVar155 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_
              ;
              fVar132 = (fVar155 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_
              ;
              fVar133 = (fVar155 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_
              ;
              fVar134 = (fVar155 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_
              ;
              fVar146 = *(float *)(root.ptr + 0x60 + lVar39 * 4);
              fVar135 = (fVar146 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_
              ;
              fVar140 = (fVar146 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_
              ;
              fVar142 = (fVar146 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_
              ;
              fVar145 = (fVar146 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_
              ;
              fVar97 = (fVar151 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar110 = (fVar151 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar112 = (fVar151 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar114 = (fVar151 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_
              ;
              fVar151 = (fVar158 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_
              ;
              fVar155 = (fVar158 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_
              ;
              fVar73 = (fVar158 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar158 = (fVar158 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_
              ;
              fVar146 = *(float *)(root.ptr + 0x70 + lVar39 * 4);
              fVar161 = (fVar146 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_
              ;
              fVar165 = (fVar146 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_
              ;
              fVar167 = (fVar146 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_
              ;
              fVar146 = (fVar146 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_
              ;
              uVar31 = (uint)((int)fVar97 < (int)fVar116) * (int)fVar97 |
                       (uint)((int)fVar97 >= (int)fVar116) * (int)fVar116;
              uVar152 = (uint)((int)fVar110 < (int)fVar123) * (int)fVar110 |
                        (uint)((int)fVar110 >= (int)fVar123) * (int)fVar123;
              uVar156 = (uint)((int)fVar112 < (int)fVar125) * (int)fVar112 |
                        (uint)((int)fVar112 >= (int)fVar125) * (int)fVar125;
              uVar159 = (uint)((int)fVar114 < (int)fVar127) * (int)fVar114 |
                        (uint)((int)fVar114 >= (int)fVar127) * (int)fVar127;
              uVar170 = (uint)((int)fVar151 < (int)fVar129) * (int)fVar151 |
                        (uint)((int)fVar151 >= (int)fVar129) * (int)fVar129;
              uVar172 = (uint)((int)fVar155 < (int)fVar132) * (int)fVar155 |
                        (uint)((int)fVar155 >= (int)fVar132) * (int)fVar132;
              uVar174 = (uint)((int)fVar73 < (int)fVar133) * (int)fVar73 |
                        (uint)((int)fVar73 >= (int)fVar133) * (int)fVar133;
              uVar176 = (uint)((int)fVar158 < (int)fVar134) * (int)fVar158 |
                        (uint)((int)fVar158 >= (int)fVar134) * (int)fVar134;
              uVar170 = ((int)uVar170 < (int)uVar31) * uVar31 |
                        ((int)uVar170 >= (int)uVar31) * uVar170;
              uVar172 = ((int)uVar172 < (int)uVar152) * uVar152 |
                        ((int)uVar172 >= (int)uVar152) * uVar172;
              uVar174 = ((int)uVar174 < (int)uVar156) * uVar156 |
                        ((int)uVar174 >= (int)uVar156) * uVar174;
              uVar176 = ((int)uVar176 < (int)uVar159) * uVar159 |
                        ((int)uVar176 >= (int)uVar159) * uVar176;
              uVar31 = (uint)((int)fVar161 < (int)fVar135) * (int)fVar161 |
                       (uint)((int)fVar161 >= (int)fVar135) * (int)fVar135;
              uVar152 = (uint)((int)fVar165 < (int)fVar140) * (int)fVar165 |
                        (uint)((int)fVar165 >= (int)fVar140) * (int)fVar140;
              uVar156 = (uint)((int)fVar167 < (int)fVar142) * (int)fVar167 |
                        (uint)((int)fVar167 >= (int)fVar142) * (int)fVar142;
              uVar159 = (uint)((int)fVar146 < (int)fVar145) * (int)fVar146 |
                        (uint)((int)fVar146 >= (int)fVar145) * (int)fVar145;
              auVar148._0_4_ =
                   ((int)uVar31 < (int)uVar170) * uVar170 | ((int)uVar31 >= (int)uVar170) * uVar31;
              auVar148._4_4_ =
                   ((int)uVar152 < (int)uVar172) * uVar172 |
                   ((int)uVar152 >= (int)uVar172) * uVar152;
              auVar148._8_4_ =
                   ((int)uVar156 < (int)uVar174) * uVar174 |
                   ((int)uVar156 >= (int)uVar174) * uVar156;
              auVar148._12_4_ =
                   ((int)uVar159 < (int)uVar176) * uVar176 |
                   ((int)uVar159 >= (int)uVar176) * uVar159;
              uVar170 = (uint)((int)fVar97 < (int)fVar116) * (int)fVar116 |
                        (uint)((int)fVar97 >= (int)fVar116) * (int)fVar97;
              uVar172 = (uint)((int)fVar110 < (int)fVar123) * (int)fVar123 |
                        (uint)((int)fVar110 >= (int)fVar123) * (int)fVar110;
              uVar174 = (uint)((int)fVar112 < (int)fVar125) * (int)fVar125 |
                        (uint)((int)fVar112 >= (int)fVar125) * (int)fVar112;
              uVar176 = (uint)((int)fVar114 < (int)fVar127) * (int)fVar127 |
                        (uint)((int)fVar114 >= (int)fVar127) * (int)fVar114;
              uVar31 = (uint)((int)fVar151 < (int)fVar129) * (int)fVar129 |
                       (uint)((int)fVar151 >= (int)fVar129) * (int)fVar151;
              uVar152 = (uint)((int)fVar155 < (int)fVar132) * (int)fVar132 |
                        (uint)((int)fVar155 >= (int)fVar132) * (int)fVar155;
              uVar156 = (uint)((int)fVar73 < (int)fVar133) * (int)fVar133 |
                        (uint)((int)fVar73 >= (int)fVar133) * (int)fVar73;
              uVar159 = (uint)((int)fVar158 < (int)fVar134) * (int)fVar134 |
                        (uint)((int)fVar158 >= (int)fVar134) * (int)fVar158;
              uVar31 = ((int)uVar170 < (int)uVar31) * uVar170 |
                       ((int)uVar170 >= (int)uVar31) * uVar31;
              uVar152 = ((int)uVar172 < (int)uVar152) * uVar172 |
                        ((int)uVar172 >= (int)uVar152) * uVar152;
              uVar156 = ((int)uVar174 < (int)uVar156) * uVar174 |
                        ((int)uVar174 >= (int)uVar156) * uVar156;
              uVar159 = ((int)uVar176 < (int)uVar159) * uVar176 |
                        ((int)uVar176 >= (int)uVar159) * uVar159;
              uVar170 = (uint)((int)fVar161 < (int)fVar135) * (int)fVar135 |
                        (uint)((int)fVar161 >= (int)fVar135) * (int)fVar161;
              uVar172 = (uint)((int)fVar165 < (int)fVar140) * (int)fVar140 |
                        (uint)((int)fVar165 >= (int)fVar140) * (int)fVar165;
              uVar174 = (uint)((int)fVar167 < (int)fVar142) * (int)fVar142 |
                        (uint)((int)fVar167 >= (int)fVar142) * (int)fVar167;
              uVar176 = (uint)((int)fVar146 < (int)fVar145) * (int)fVar145 |
                        (uint)((int)fVar146 >= (int)fVar145) * (int)fVar146;
              uVar31 = ((int)uVar31 < (int)uVar170) * uVar31 |
                       ((int)uVar31 >= (int)uVar170) * uVar170;
              uVar152 = ((int)uVar152 < (int)uVar172) * uVar152 |
                        ((int)uVar152 >= (int)uVar172) * uVar172;
              uVar156 = ((int)uVar156 < (int)uVar174) * uVar156 |
                        ((int)uVar156 >= (int)uVar174) * uVar174;
              uVar159 = ((int)uVar159 < (int)uVar176) * uVar159 |
                        ((int)uVar159 >= (int)uVar176) * uVar176;
              auVar57._4_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar148._4_4_) * auVar148._4_4_
                                  | (uint)(tray.tnear.field_0.i[1] >= (int)auVar148._4_4_) *
                                    tray.tnear.field_0.i[1]) <=
                          (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar152) *
                                  tray.tfar.field_0.i[1] |
                                 (tray.tfar.field_0.i[1] >= (int)uVar152) * uVar152));
              auVar57._0_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar148._0_4_) * auVar148._0_4_
                                  | (uint)(tray.tnear.field_0.i[0] >= (int)auVar148._0_4_) *
                                    tray.tnear.field_0.i[0]) <=
                          (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar31) *
                                  tray.tfar.field_0.i[0] |
                                 (tray.tfar.field_0.i[0] >= (int)uVar31) * uVar31));
              auVar57._8_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar148._8_4_) * auVar148._8_4_
                                  | (uint)(tray.tnear.field_0.i[2] >= (int)auVar148._8_4_) *
                                    tray.tnear.field_0.i[2]) <=
                          (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar156) *
                                  tray.tfar.field_0.i[2] |
                                 (tray.tfar.field_0.i[2] >= (int)uVar156) * uVar156));
              auVar57._12_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar148._12_4_) *
                                   auVar148._12_4_ |
                                  (uint)(tray.tnear.field_0.i[3] >= (int)auVar148._12_4_) *
                                  tray.tnear.field_0.i[3]) <=
                          (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar159) *
                                  tray.tfar.field_0.i[3] |
                                 (tray.tfar.field_0.i[3] >= (int)uVar159) * uVar159));
              uVar31 = movmskps((int)valid_i,auVar57);
              valid_i = (vint<4> *)(ulong)uVar31;
              aVar100 = aVar79;
              if ((uVar31 != 0) &&
                 (auVar99._4_4_ = iVar195, auVar99._0_4_ = iVar37, auVar99._8_4_ = iVar198,
                 auVar99._12_4_ = iVar201,
                 aVar100 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           blendvps(auVar99,auVar148,auVar57), sVar43 = sVar9, sVar45 != 8)) {
                pNVar53->ptr = sVar45;
                pNVar53 = pNVar53 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar49->v = aVar79;
                paVar49 = paVar49 + 1;
              }
              aVar79 = aVar100;
              lVar39 = lVar39 + 1;
              sVar45 = sVar43;
            } while (lVar39 != 4);
            uVar31 = 4;
            if (sVar43 == 8) goto LAB_00dc13ee;
            auVar58._4_4_ = -(uint)(aVar79.v[1] < tray.tfar.field_0.v[1]);
            auVar58._0_4_ = -(uint)(aVar79.v[0] < tray.tfar.field_0.v[0]);
            auVar58._8_4_ = -(uint)(aVar79.v[2] < tray.tfar.field_0.v[2]);
            auVar58._12_4_ = -(uint)(aVar79.v[3] < tray.tfar.field_0.v[3]);
            uVar35 = movmskps((int)pRVar36,auVar58);
            pRVar36 = (RTCIntersectArguments *)(ulong)(uint)POPCOUNT(uVar35);
            root.ptr = sVar43;
          } while ((byte)uVar38 < (byte)POPCOUNT(uVar35));
          pNVar53->ptr = sVar43;
          pNVar53 = pNVar53 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar49->v = aVar79;
          paVar49 = paVar49 + 1;
        }
        else {
          do {
            k = (RTCIntersectArguments *)0x0;
            if (uVar52 != 0) {
              for (; (uVar52 >> (long)k & 1) == 0;
                  k = (RTCIntersectArguments *)((long)&k->flags + 1)) {
              }
            }
            pRVar36 = k;
            valid_i = (vint<4> *)This;
            bVar54 = occluded1(This,bvh,root,(size_t)k,&pre,ray,&tray,context);
            if (bVar54) {
              terminated.field_0.i[(long)k] = -1;
            }
            uVar44 = uVar52 - 1;
            uVar52 = uVar52 & uVar44;
          } while (uVar52 != 0);
          iVar37 = movmskps((int)uVar44,(undefined1  [16])terminated.field_0);
          if (iVar37 == 0xf) {
            uVar31 = 3;
          }
          else {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            uVar31 = 2;
          }
          iVar37 = 0x7f800000;
          iVar195 = 0x7f800000;
          iVar198 = 0x7f800000;
          iVar201 = 0x7f800000;
          if (uVar38 < (uint)POPCOUNT(uVar152)) goto LAB_00dc124a;
        }
LAB_00dc13ee:
      } while ((uVar31 == 4) || (uVar31 == 2));
LAB_00dc29de:
      auVar72._0_4_ = uVar75 & terminated.field_0.i[0];
      auVar72._4_4_ = uVar91 & terminated.field_0.i[1];
      auVar72._8_4_ = auVar77._8_4_ & terminated.field_0.i[2];
      auVar72._12_4_ = auVar77._12_4_ & terminated.field_0.i[3];
      auVar118 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar72);
      *(undefined1 (*) [16])(ray + 0x80) = auVar118;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }